

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::ModfCase::compare(ModfCase *this,void **inputs,void **outputs)

{
  float fVar1;
  Precision PVar2;
  pointer pSVar3;
  uint uVar4;
  ostream *poVar5;
  float fVar6;
  ostringstream *this_00;
  ulong uVar7;
  bool bVar8;
  float fVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  deUint32 u32;
  float fVar13;
  Hex<8UL> local_80;
  HexFloat local_74;
  HexFloat local_70;
  HexFloat local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar3->varType).m_data.basic.precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (0 < (int)uVar4) {
    uVar7 = 0;
    bVar8 = false;
    do {
      fVar1 = *(float *)((long)*inputs + uVar7 * 4);
      fVar13 = fVar1 - (float)(int)fVar1;
      iVar11 = 0;
      if ((PVar2 != PRECISION_HIGHP) &&
         (uVar10 = ~-(uint)(((uint)fVar1 & 0x7fffff) == 0) &
                   -(uint)(((uint)fVar1 & 0x7f800000) == 0),
         uVar12 = ~-(uint)(((uint)fVar13 & 0x7fffff) == 0) &
                  -(uint)(((uint)fVar13 & 0x7f800000) == 0),
         iVar11 = (uVar10 & 0xffffff82 | ~uVar10 & ((uint)fVar1 >> 0x17 & 0xff) - 0x7f) -
                  (uVar12 & 0xffffff82 | ~uVar12 & ((uint)fVar13 >> 0x17 & 0xff) - 0x7f), iVar11 < 1
         )) {
        iVar11 = 0;
      }
      iVar11 = *(int *)(&DAT_00b1d5f8 + (ulong)PVar2 * 4) - iVar11;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      fVar9 = *(float *)((long)outputs[1] + uVar7 * 4) + *(float *)((long)*outputs + uVar7 * 4);
      if (PVar2 == PRECISION_HIGHP) {
LAB_006601f6:
        fVar6 = (float)((int)fVar1 - (int)fVar9);
        if ((uint)fVar1 < (uint)fVar9) {
          fVar6 = (float)-((int)fVar1 - (int)fVar9);
        }
      }
      else if ((fVar9 != 0.0) || (NAN(fVar9))) {
        if ((fVar1 != 0.0) || (NAN(fVar1))) goto LAB_006601f6;
        fVar6 = ABS(fVar9);
      }
      else {
        fVar6 = ABS(fVar1);
      }
      fVar9 = (float)~(-1 << (0x17U - (char)iVar11 & 0x1f));
      if ((uint)fVar9 < (uint)fVar6) {
        this_00 = &(this->super_CommonFunctionCase).m_failMsg;
        local_48 = ZEXT416((uint)fVar1);
        local_58 = ZEXT416((uint)(float)(int)fVar1);
        local_68 = ZEXT416((uint)fVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)uVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = (",5);
        local_6c.value = (float)local_68._0_4_;
        poVar5 = Functional::operator<<(poVar5,&local_6c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") + (",5);
        local_70.value = (float)local_58._0_4_;
        poVar5 = Functional::operator<<(poVar5,&local_70);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") = ",4);
        local_74.value = (float)local_48._0_4_;
        poVar5 = Functional::operator<<(poVar5,&local_74);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," with ULP threshold ",0x14);
        local_80.value = (deUint64)(uint)fVar9;
        poVar5 = tcu::Format::Hex<8UL>::toStream(&local_80,poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", got ULP diff ",0xf);
        local_80.value = (deUint64)(uint)fVar6;
        tcu::Format::Hex<8UL>::toStream(&local_80,poVar5);
        return bVar8;
      }
      uVar7 = uVar7 + 1;
      bVar8 = uVar4 <= uVar7;
    } while (uVar7 != uVar4);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const float		out1		= ((const float*)outputs[1])[compNdx];

			const float		refOut1		= float(int(in0));
			const float		refOut0		= in0 - refOut1;

			const int		bitsLost	= precision != glu::PRECISION_HIGHP ? numBitsLostInOp(in0, refOut0) : 0;
			const deUint32	maxUlpDiff	= getMaxUlpDiffFromBits(de::max(mantissaBits - bitsLost, 0));

			const float		resSum		= out0 + out1;

			const deUint32	ulpDiff		= hasZeroSign ? getUlpDiff(resSum, in0) : getUlpDiffIgnoreZeroSign(resSum, in0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = (" << HexFloat(refOut0) << ") + (" << HexFloat(refOut1) << ") = " << HexFloat(in0) << " with ULP threshold "
							<< tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}